

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O0

real __thiscall fasttext::Loss::sigmoid(Loss *this,real x)

{
  const_reference pvVar1;
  long in_RDI;
  float in_XMM0_Da;
  int64_t i;
  undefined4 local_4;
  
  if (-8.0 <= in_XMM0_Da) {
    if (in_XMM0_Da <= 8.0) {
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 8),
                          (long)((((in_XMM0_Da + 8.0) * 512.0) / 8.0) / 2.0));
      local_4 = *pvVar1;
    }
    else {
      local_4 = 1.0;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

real Loss::sigmoid(real x) const {
  if (x < -MAX_SIGMOID) {
    return 0.0;
  } else if (x > MAX_SIGMOID) {
    return 1.0;
  } else {
    int64_t i =
        int64_t((x + MAX_SIGMOID) * SIGMOID_TABLE_SIZE / MAX_SIGMOID / 2);
    return t_sigmoid_[i];
  }
}